

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::ExpandRuleVariables(cmLocalGenerator *this,string *s,RuleVariables *replaceValues)

{
  cmTarget *target;
  RuleVariables *pRVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  string local_118 [32];
  string local_f8 [32];
  undefined1 local_d8 [8];
  string replace;
  string var;
  char c;
  size_type end;
  string expandedInput;
  size_type pos;
  size_type start;
  allocator local_41;
  string local_40;
  RuleVariables *local_20;
  RuleVariables *replaceValues_local;
  string *s_local;
  cmLocalGenerator *this_local;
  
  local_20 = replaceValues;
  replaceValues_local = (RuleVariables *)s;
  s_local = (string *)this;
  if (replaceValues->RuleLauncher != (char *)0x0) {
    target = replaceValues->CMTarget;
    pcVar4 = replaceValues->RuleLauncher;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar4,&local_41);
    InsertRuleLauncher(this,s,target,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  pos = std::__cxx11::string::find((char)replaceValues_local,0x3c);
  if (pos != 0xffffffffffffffff) {
    expandedInput.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)&end);
    while( true ) {
      bVar5 = false;
      if (pos != 0xffffffffffffffff) {
        lVar3 = std::__cxx11::string::size();
        bVar5 = pos < lVar3 - 2U;
      }
      pRVar1 = replaceValues_local;
      if (!bVar5) break;
      lVar3 = std::__cxx11::string::find((char)replaceValues_local,0x3e);
      if (lVar3 == -1) goto LAB_00646105;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)replaceValues_local);
      iVar2 = isalpha((int)*pcVar4);
      if (iVar2 == 0) {
        pos = std::__cxx11::string::find((char)replaceValues_local,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)((long)&replace.field_2 + 8),(ulong)replaceValues_local)
        ;
        ExpandRuleVariable((string *)local_d8,this,(string *)((long)&replace.field_2 + 8),local_20);
        std::__cxx11::string::substr((ulong)local_f8,(ulong)replaceValues_local);
        std::__cxx11::string::operator+=((string *)&end,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::operator+=((string *)&end,(string *)local_d8);
        pRVar1 = replaceValues_local;
        std::__cxx11::string::size();
        pos = std::__cxx11::string::find((char)pRVar1,0x3c);
        expandedInput.field_2._8_8_ = lVar3 + 1;
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)(replace.field_2._M_local_buf + 8));
      }
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_118,(ulong)pRVar1);
    std::__cxx11::string::operator+=((string *)&end,local_118);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::operator=((string *)replaceValues_local,(string *)&end);
LAB_00646105:
    std::__cxx11::string::~string((string *)&end);
  }
  return;
}

Assistant:

void
cmLocalGenerator::ExpandRuleVariables(std::string& s,
                                      const RuleVariables& replaceValues)
{
  if(replaceValues.RuleLauncher)
    {
    this->InsertRuleLauncher(s, replaceValues.CMTarget,
                             replaceValues.RuleLauncher);
    }
  std::string::size_type start = s.find('<');
  // no variables to expand
  if(start == s.npos)
    {
    return;
    }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while(start != s.npos && start < s.size()-2)
    {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if(end == s.npos)
      {
      return;
      }
    char c = s[start+1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if(!isalpha(c))
      {
      start = s.find('<', start+1);
      }
    else
      {
      // extract the var
      std::string var = s.substr(start+1,  end - start-1);
      std::string replace = this->ExpandRuleVariable(var,
                                                     replaceValues);
      expandedInput += s.substr(pos, start-pos);
      expandedInput += replace;
      // move to next one
      start = s.find('<', start+var.size()+2);
      pos = end+1;
      }
    }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size()-pos);
  s = expandedInput;
}